

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O1

char * mp_decode_ext(char **data,int8_t *type,uint32_t *len)

{
  char cVar1;
  int8_t iVar2;
  ushort uVar3;
  char *pcVar4;
  uint uVar5;
  
  if (len == (uint32_t *)0x0) {
    __assert_fail("len != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h",
                  0x86f,"const char *mp_decode_ext(const char **, int8_t *, uint32_t *)");
  }
  pcVar4 = *data;
  cVar1 = *pcVar4;
  *data = pcVar4 + 1;
  switch(cVar1) {
  case -0x39:
    uVar5 = (uint)(byte)pcVar4[1];
    pcVar4 = pcVar4 + 2;
    break;
  case -0x38:
    uVar3 = *(ushort *)(pcVar4 + 1);
    *data = pcVar4 + 3;
    uVar5 = (uint)(ushort)(uVar3 << 8 | uVar3 >> 8);
    goto LAB_001335a4;
  case -0x37:
    uVar5 = *(uint *)(pcVar4 + 1);
    uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    pcVar4 = pcVar4 + 5;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h",
                  0x867,"uint32_t mp_decode_extl(const char **, int8_t *)");
  case -0x2c:
  case -0x2b:
  case -0x2a:
  case -0x29:
  case -0x28:
    uVar5 = 1 << (cVar1 + 0x2cU & 0x1f);
    goto LAB_001335a4;
  }
  *data = pcVar4;
LAB_001335a4:
  iVar2 = **data;
  *data = *data + 1;
  *type = iVar2;
  *len = uVar5;
  pcVar4 = *data;
  *data = pcVar4 + uVar5;
  return pcVar4;
}

Assistant:

MP_IMPL const char *
mp_decode_ext(const char **data, int8_t *type, uint32_t *len) {
	assert(len != NULL);

	*len = mp_decode_extl(data, type);
	const char *str = *data;
	*data += *len;
	return str;
}